

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O2

uint __thiscall
siamese::DecoderPacketWindow::FindNextGotElement(DecoderPacketWindow *this,uint elementStart)

{
  DecoderSubwindow *pDVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = this->Count;
  if (elementStart < uVar2) {
    uVar4 = elementStart & 0x3f;
    uVar3 = elementStart & 0xffffffc0;
    for (uVar5 = (ulong)(elementStart >> 6); uVar5 < uVar2 + 0x3f >> 6; uVar5 = uVar5 + 1) {
      pDVar1 = (this->Subwindows).DataPtr[uVar5];
      if ((pDVar1->GotCount != 0) &&
         (uVar4 = pktalloc::CustomBitSet<64U>::FindFirstSet(&pDVar1->Got,uVar4,0x40), uVar4 < 0x40))
      {
        if (uVar4 + uVar3 < this->Count) {
          return uVar4 + uVar3;
        }
        return this->Count;
      }
      uVar3 = uVar3 + 0x40;
      uVar4 = 0;
    }
    uVar2 = this->Count;
  }
  return uVar2;
}

Assistant:

unsigned DecoderPacketWindow::FindNextGotElement(unsigned elementStart)
{
    if (elementStart >= Count) {
        return Count;
    }

    const unsigned subwindowEnd = (Count + kSubwindowSize - 1) / kSubwindowSize;
    unsigned subwindowIndex = elementStart / kSubwindowSize;
    unsigned bitIndex = elementStart % kSubwindowSize;
    SIAMESE_DEBUG_ASSERT(subwindowEnd <= Subwindows.GetSize());
    SIAMESE_DEBUG_ASSERT(subwindowIndex < Subwindows.GetSize());

    while (subwindowIndex < subwindowEnd)
    {
        // If there may be any got packets in this subwindow:
        if (Subwindows.GetRef(subwindowIndex)->GotCount > 0)
        {
            for (;;)
            {
                // Seek next set bit
                bitIndex = Subwindows.GetRef(subwindowIndex)->Got.FindFirstSet(bitIndex);

                // If there were none, skip this subwindow
                if (bitIndex >= kSubwindowSize) {
                    break;
                }

                // Calculate element index and stop if we hit the end of the valid data
                unsigned nextElement = subwindowIndex * kSubwindowSize + bitIndex;
                if (nextElement > Count) {
                    nextElement = Count;
                }

                return nextElement;
            }
        }

        // Reset bit index to the front of the next subwindow
        bitIndex = 0;

        // Check next subwindow
        ++subwindowIndex;
    }

    return Count;
}